

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::showXRefTable(QPDF *this)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  element_type *peVar4;
  element_type *peVar5;
  Pipeline *pPVar6;
  qpdf_offset_t i;
  logic_error *this_00;
  shared_ptr<Pipeline> local_98 [2];
  string local_78;
  QPDFXRefEntry *local_58;
  QPDFXRefEntry *entry;
  QPDFObjGen *og;
  pair<const_QPDFObjGen,_QPDFXRefEntry> *iter;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range1;
  element_type *local_18;
  element_type *cout;
  QPDF *this_local;
  
  cout = (element_type *)this;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      pMVar3);
  QPDFLogger::getInfo((QPDFLogger *)&__range1,SUB81(peVar4,0));
  peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &__range1);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&__range1);
  local_18 = peVar5;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  __end1 = std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::begin(&pMVar3->xref_table);
  iter = (pair<const_QPDFObjGen,_QPDFXRefEntry> *)
         std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::end(&pMVar3->xref_table);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar1) {
      return;
    }
    entry = (QPDFXRefEntry *)
            std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*(&__end1);
    peVar5 = local_18;
    local_58 = &((reference)entry)->second;
    og = (QPDFObjGen *)entry;
    QPDFObjGen::unparse_abi_cxx11_(&local_78,(QPDFObjGen *)entry,'/');
    pPVar6 = Pipeline::operator<<(peVar5,&local_78);
    Pipeline::operator<<(pPVar6,": ");
    std::__cxx11::string::~string((string *)&local_78);
    iVar2 = QPDFXRefEntry::getType(local_58);
    if (iVar2 == 1) {
      pPVar6 = Pipeline::operator<<(local_18,"uncompressed; offset = ");
      i = QPDFXRefEntry::getOffset(local_58);
      Pipeline::operator<<(pPVar6,i);
    }
    else {
      if (iVar2 != 2) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"unknown cross-reference table type while showing xref_table");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pMVar3);
      QPDFLogger::getInfo((QPDFLogger *)local_98,SUB81(peVar4,0));
      peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_98);
      pPVar6 = Pipeline::operator<<(peVar5,"compressed; stream = ");
      iVar2 = QPDFXRefEntry::getObjStreamNumber(local_58);
      pPVar6 = Pipeline::operator<<(pPVar6,iVar2);
      pPVar6 = Pipeline::operator<<(pPVar6,", index = ");
      iVar2 = QPDFXRefEntry::getObjStreamIndex(local_58);
      Pipeline::operator<<(pPVar6,iVar2);
      std::shared_ptr<Pipeline>::~shared_ptr(local_98);
    }
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )pMVar3);
    QPDFLogger::info(peVar4,"\n");
    std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end1);
  } while( true );
}

Assistant:

void
QPDF::showXRefTable()
{
    auto& cout = *m->log->getInfo();
    for (auto const& iter: m->xref_table) {
        QPDFObjGen const& og = iter.first;
        QPDFXRefEntry const& entry = iter.second;
        cout << og.unparse('/') << ": ";
        switch (entry.getType()) {
        case 1:
            cout << "uncompressed; offset = " << entry.getOffset();
            break;

        case 2:
            *m->log->getInfo() << "compressed; stream = " << entry.getObjStreamNumber()
                               << ", index = " << entry.getObjStreamIndex();
            break;

        default:
            throw std::logic_error("unknown cross-reference table type while showing xref_table");
            break;
        }
        m->log->info("\n");
    }
}